

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void __thiscall xatlas::internal::param::Chart::~Chart(Chart *this)

{
  if (this->m_mesh != (Mesh *)0x0) {
    Mesh::~Mesh(this->m_mesh);
    if (this->m_mesh != (Mesh *)0x0) {
      if (s_free == (undefined *)0x0) {
        (*(code *)s_realloc)(this->m_mesh,0);
      }
      else {
        (*(code *)s_free)();
      }
    }
  }
  if (this->m_unifiedMesh != (Mesh *)0x0) {
    Mesh::~Mesh(this->m_unifiedMesh);
    if (this->m_unifiedMesh != (Mesh *)0x0) {
      if (s_free == (undefined *)0x0) {
        (*(code *)s_realloc)(this->m_unifiedMesh,0);
      }
      else {
        (*(code *)s_free)();
      }
    }
  }
  if (this->m_unmodifiedUnifiedMesh != (Mesh *)0x0) {
    Mesh::~Mesh(this->m_unmodifiedUnifiedMesh);
    if (this->m_unmodifiedUnifiedMesh != (Mesh *)0x0) {
      if (s_free == (undefined *)0x0) {
        (*(code *)s_realloc)(this->m_unmodifiedUnifiedMesh,0);
      }
      else {
        (*(code *)s_free)();
      }
    }
  }
  ArrayBase::~ArrayBase(&(this->m_chartToUnifiedMap).m_base);
  ArrayBase::~ArrayBase(&(this->m_chartToOriginalMap).m_base);
  ArrayBase::~ArrayBase(&(this->m_faceArray).m_base);
  return;
}

Assistant:

~Chart()
	{
		if (m_mesh) {
			m_mesh->~Mesh();
			XA_FREE(m_mesh);
		}
		if (m_unifiedMesh) {
			m_unifiedMesh->~Mesh();
			XA_FREE(m_unifiedMesh);
		}
		if (m_unmodifiedUnifiedMesh) {
			m_unmodifiedUnifiedMesh->~Mesh();
			XA_FREE(m_unmodifiedUnifiedMesh);
		}
	}